

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

MPP_RET output_dpb_fastplay(H264_DpbBuf_t *p_Dpb,H264_FrameStore_t *fs,RK_U32 is_i_frm)

{
  MPP_RET MVar1;
  MPP_RET ret;
  RK_U32 is_i_frm_local;
  H264_FrameStore_t *fs_local;
  H264_DpbBuf_t *p_Dpb_local;
  
  if ((p_Dpb->p_Vid->dpb_fast_out == 0) || (is_i_frm == 0)) {
    output_dpb_normal(p_Dpb);
  }
  else {
    MVar1 = write_stored_frame(p_Dpb->p_Vid,p_Dpb,fs);
    if (MVar1 < MPP_OK) {
      if ((h264d_debug & 4) == 0) {
        return MVar1;
      }
      _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x539);
      return MVar1;
    }
  }
  return MPP_OK;
}

Assistant:

static MPP_RET output_dpb_fastplay(H264_DpbBuf_t *p_Dpb, H264_FrameStore_t *fs, RK_U32 is_i_frm)
{
    MPP_RET ret = MPP_NOK;

    if ((p_Dpb->p_Vid->dpb_fast_out && is_i_frm)) {
        FUN_CHECK(ret = write_stored_frame(p_Dpb->p_Vid, p_Dpb, fs));
    } else
        output_dpb_normal(p_Dpb);

    return MPP_OK;
__FAILED:
    return ret;
}